

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O3

void __thiscall Trie::Trie(Trie *this)

{
  _Rb_tree_header *p_Var1;
  trie_node_t *ptVar2;
  
  (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ptVar2 = (trie_node_t *)operator_new(0x40);
  p_Var1 = &(ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header;
  (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ptVar2->search_clue = (trie_node_t *)0x0;
  ptVar2->infoIndex = -1;
  this->root = ptVar2;
  this->size = 0;
  return;
}

Assistant:

Trie::Trie()
{
	root = new trie_node_t;
	size = 0;
}